

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS ref_egads_invert(REF_GEOM ref_geom,REF_INT type,REF_INT id,REF_DBL *xyz0,REF_DBL *uv)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_DBL tol;
  REF_INT i;
  REF_DBL duv [2];
  REF_DBL drs [2];
  REF_DBL n [3];
  double local_168;
  REF_DBL s [3];
  double local_148;
  REF_DBL r [3];
  double local_128;
  REF_DBL duvdrs [4];
  REF_DBL drsduv [4];
  REF_DBL dxyz_dtuv [15];
  REF_DBL error [3];
  double local_48;
  REF_DBL xyz [3];
  REF_DBL *uv_local;
  REF_DBL *xyz0_local;
  REF_INT id_local;
  REF_INT type_local;
  REF_GEOM ref_geom_local;
  
  tol._4_4_ = 0;
  xyz[2] = (REF_DBL)uv;
  while( true ) {
    if (0x13 < tol._4_4_) {
      return 1;
    }
    uVar1 = ref_egads_eval_at(ref_geom,type,id,(REF_DBL *)xyz[2],&local_48,drsduv + 3);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0xed0
             ,"ref_egads_invert",(ulong)uVar1,"eval");
      return uVar1;
    }
    dVar2 = local_48 - *xyz0;
    dVar3 = xyz[0] - xyz0[1];
    dVar4 = xyz[1] - xyz0[2];
    uVar1 = ref_geom_face_rsn(ref_geom,id,(REF_DBL *)xyz[2],&local_148,&local_168,drs + 1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0xed4
             ,"ref_egads_invert",(ulong)uVar1,"rsn");
      return uVar1;
    }
    duvdrs[3] = dxyz_dtuv[1] * r[1] + drsduv[3] * local_148 + dxyz_dtuv[0] * r[0];
    drsduv[0] = dxyz_dtuv[1] * s[1] + drsduv[3] * local_168 + dxyz_dtuv[0] * s[0];
    drsduv[1] = dxyz_dtuv[4] * r[1] + dxyz_dtuv[2] * local_148 + dxyz_dtuv[3] * r[0];
    drsduv[2] = dxyz_dtuv[4] * s[1] + dxyz_dtuv[2] * local_168 + dxyz_dtuv[3] * s[0];
    uVar1 = ref_matrix_inv_gen(2,duvdrs + 3,&local_128);
    if (uVar1 != 0) break;
    dVar5 = r[1] * dVar4 + local_148 * dVar2 + r[0] * dVar3;
    drs[0] = s[1] * dVar4 + local_168 * dVar2 + s[0] * dVar3;
    *(double *)xyz[2] = *(double *)xyz[2] - (local_128 * dVar5 + duvdrs[1] * drs[0]);
    *(double *)((long)xyz[2] + 8) =
         *(double *)((long)xyz[2] + 8) - (duvdrs[0] * dVar5 + duvdrs[2] * drs[0]);
    dVar2 = sqrt(dVar5 * dVar5 + drs[0] * drs[0]);
    if (dVar2 < 1e-14) {
      return 0;
    }
    tol._4_4_ = tol._4_4_ + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0xedb,
         "ref_egads_invert",(ulong)uVar1,"inv");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_egads_invert(REF_GEOM ref_geom, REF_INT type, REF_INT id,
                                    REF_DBL *xyz0, REF_DBL *uv) {
  REF_DBL xyz[3], error[3];
  REF_DBL dxyz_dtuv[15];
  REF_DBL drsduv[4], duvdrs[4];
  REF_DBL r[3], s[3], n[3];
  REF_DBL drs[2], duv[2];
  REF_INT i;
  REF_DBL tol = 1.0e-14;
  REF_BOOL verbose = REF_FALSE;

  for (i = 0; i < 20; i++) {
    RSS(ref_egads_eval_at(ref_geom, type, id, uv, xyz, dxyz_dtuv), "eval");
    error[0] = xyz[0] - xyz0[0];
    error[1] = xyz[1] - xyz0[1];
    error[2] = xyz[2] - xyz0[2];
    RSS(ref_geom_face_rsn(ref_geom, id, uv, r, s, n), "rsn");
    /* [x_u,y_u,z_u] [x_v,y_v,z_v] */
    /*  drsduv = [r s] * dxyz_dtuv */
    drsduv[0] = dxyz_dtuv[0] * r[0] + dxyz_dtuv[1] * r[1] + dxyz_dtuv[2] * r[2];
    drsduv[1] = dxyz_dtuv[0] * s[0] + dxyz_dtuv[1] * s[1] + dxyz_dtuv[2] * s[2];
    drsduv[2] = dxyz_dtuv[3] * r[0] + dxyz_dtuv[4] * r[1] + dxyz_dtuv[5] * r[2];
    drsduv[3] = dxyz_dtuv[3] * s[0] + dxyz_dtuv[4] * s[1] + dxyz_dtuv[5] * s[2];
    RSS(ref_matrix_inv_gen(2, drsduv, duvdrs), "inv");
    drs[0] = ref_math_dot(r, error);
    drs[1] = ref_math_dot(s, error);
    if (verbose)
      printf(" r %e s %e err %e on %d\n", drs[0], drs[1],
             sqrt(ref_math_dot(error, error)), i);
    duv[0] = duvdrs[0] * drs[0] + duvdrs[2] * drs[1];
    duv[1] = duvdrs[1] * drs[0] + duvdrs[3] * drs[1];
    uv[0] = uv[0] - duv[0];
    uv[1] = uv[1] - duv[1];
    if (sqrt(drs[0] * drs[0] + drs[1] * drs[1]) < tol) {
      return REF_SUCCESS;
    }
  }
  return REF_FAILURE;
}